

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::append_member_name
          (CompilerMSL *this,string *qualifier,SPIRType *type,uint32_t index)

{
  bool bVar1;
  undefined4 in_register_0000000c;
  uint32_t in_R8D;
  allocator local_85 [13];
  string local_78 [32];
  long local_58;
  size_t startPos;
  string mbr_name;
  BuiltIn local_30 [2];
  BuiltIn builtin;
  uint32_t index_local;
  SPIRType *type_local;
  string *qualifier_local;
  CompilerMSL *this_local;
  
  _builtin = (SPIRType *)CONCAT44(in_register_0000000c,index);
  local_30[0] = BuiltInMax;
  type_local = type;
  qualifier_local = qualifier;
  this_local = this;
  bVar1 = Compiler::is_member_builtin((Compiler *)qualifier,_builtin,in_R8D,local_30);
  if (bVar1) {
    (**(code **)(*(long *)qualifier + 0xa0))(this,qualifier,local_30[0],_builtin->storage);
  }
  else {
    CompilerGLSL::to_member_name_abi_cxx11_
              ((CompilerGLSL *)&startPos,(SPIRType *)qualifier,(uint32_t)_builtin);
    local_58 = ::std::__cxx11::string::find_first_not_of((char *)&startPos,0x40fecd);
    bVar1 = local_58 == -1;
    if (bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_78,"",local_85);
    }
    else {
      ::std::__cxx11::string::substr((ulong)local_78,(ulong)&startPos);
    }
    ::std::__cxx11::string::operator=((string *)&startPos,local_78);
    ::std::__cxx11::string::~string(local_78);
    if (bVar1) {
      ::std::allocator<char>::~allocator((allocator<char> *)local_85);
    }
    join<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string&>
              ((spirv_cross *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)type_local,
               (char (*) [2])0x40fecd,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&startPos);
    ::std::__cxx11::string::~string((string *)&startPos);
  }
  return this;
}

Assistant:

string CompilerMSL::append_member_name(const string &qualifier, const SPIRType &type, uint32_t index)
{
	// Don't qualify Builtin names because they are unique and are treated as such when building expressions
	BuiltIn builtin = BuiltInMax;
	if (is_member_builtin(type, index, &builtin))
		return builtin_to_glsl(builtin, type.storage);

	// Strip any underscore prefix from member name
	string mbr_name = to_member_name(type, index);
	size_t startPos = mbr_name.find_first_not_of("_");
	mbr_name = (startPos != string::npos) ? mbr_name.substr(startPos) : "";
	return join(qualifier, "_", mbr_name);
}